

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_posix_time.cpp
# Opt level: O2

int main(void)

{
  ostream *poVar1;
  runtime_error *prVar2;
  ptime pVar3;
  ptime local_2b8;
  tm t_ref;
  ostringstream oss;
  
  poVar1 = std::operator<<((ostream *)&std::cout,"- Testing ptime");
  std::endl<char,std::char_traits<char>>(poVar1);
  local_2b8.sec = 0;
  local_2b8.nsec = 0;
  booster::ptime::normalize(&local_2b8);
  if ((local_2b8.sec != booster::ptime::zero) || (local_2b8.nsec != _Init)) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
    poVar1 = std::operator<<((ostream *)&oss,"Error ");
    poVar1 = std::operator<<(poVar1,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/ptime/test/test_posix_time.cpp"
                            );
    poVar1 = std::operator<<(poVar1,":");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,0x20);
    std::operator<<(poVar1," p==ptime::zero");
    prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar2,(string *)&t_ref);
    __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  if ((local_2b8.sec != 0) || (local_2b8.nsec != 0)) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
    poVar1 = std::operator<<((ostream *)&oss,"Error ");
    poVar1 = std::operator<<(poVar1,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/ptime/test/test_posix_time.cpp"
                            );
    poVar1 = std::operator<<(poVar1,":");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,0x21);
    std::operator<<(poVar1," p.get_seconds()==0 && p.get_nanoseconds()==0");
    prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar2,(string *)&t_ref);
    __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  _oss = 10;
  booster::ptime::normalize((ptime *)&oss);
  local_2b8.sec = _oss;
  _oss = 10;
  local_2b8.nsec = 0x14;
  booster::ptime::normalize((ptime *)&oss);
  if ((local_2b8.sec != _oss) || (local_2b8.nsec != 0x14)) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
    poVar1 = std::operator<<((ostream *)&oss,"Error ");
    poVar1 = std::operator<<(poVar1,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/ptime/test/test_posix_time.cpp"
                            );
    poVar1 = std::operator<<(poVar1,":");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,0x23);
    std::operator<<(poVar1," p==ptime(10,20)");
    prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar2,(string *)&t_ref);
    __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  if (local_2b8.sec != 10) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
    poVar1 = std::operator<<((ostream *)&oss,"Error ");
    poVar1 = std::operator<<(poVar1,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/ptime/test/test_posix_time.cpp"
                            );
    poVar1 = std::operator<<(poVar1,":");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,0x24);
    std::operator<<(poVar1," p.get_seconds()==10 && p.get_nanoseconds()==20");
    prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar2,(string *)&t_ref);
    __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  _oss = 0xf;
  booster::ptime::normalize((ptime *)&oss);
  local_2b8.nsec = 0;
  local_2b8.sec = _oss;
  _oss = 0xf;
  booster::ptime::normalize((ptime *)&oss);
  if ((local_2b8.sec == _oss) && (local_2b8.nsec == 0)) {
    if (local_2b8.sec != 0xf) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
      poVar1 = std::operator<<((ostream *)&oss,"Error ");
      poVar1 = std::operator<<(poVar1,
                               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/ptime/test/test_posix_time.cpp"
                              );
      poVar1 = std::operator<<(poVar1,":");
      poVar1 = (ostream *)std::ostream::operator<<(poVar1,0x28);
      std::operator<<(poVar1," p.get_seconds()==15 && p.get_nanoseconds()==0");
      prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::stringbuf::str();
      std::runtime_error::runtime_error(prVar2,(string *)&t_ref);
      __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    pVar3 = booster::ptime::milliseconds(0x834);
    local_2b8.sec = pVar3.sec;
    local_2b8.nsec = pVar3.nsec;
    if ((local_2b8.sec != 2) || (local_2b8.nsec != 100000000)) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
      poVar1 = std::operator<<((ostream *)&oss,"Error ");
      poVar1 = std::operator<<(poVar1,
                               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/ptime/test/test_posix_time.cpp"
                              );
      poVar1 = std::operator<<(poVar1,":");
      poVar1 = (ostream *)std::ostream::operator<<(poVar1,0x2c);
      std::operator<<(poVar1," p.get_seconds()==2 && p.get_nanoseconds() == 100000000");
      prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::stringbuf::str();
      std::runtime_error::runtime_error(prVar2,(string *)&t_ref);
      __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    pVar3 = booster::ptime::microseconds(0x314930);
    local_2b8.sec = pVar3.sec;
    local_2b8.nsec = pVar3.nsec;
    if ((local_2b8.sec != 3) || (local_2b8.nsec != 230000000)) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
      poVar1 = std::operator<<((ostream *)&oss,"Error ");
      poVar1 = std::operator<<(poVar1,
                               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/ptime/test/test_posix_time.cpp"
                              );
      poVar1 = std::operator<<(poVar1,":");
      poVar1 = (ostream *)std::ostream::operator<<(poVar1,0x30);
      std::operator<<(poVar1," p.get_seconds() == 3 && p.get_nanoseconds() == 230000000");
      prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::stringbuf::str();
      std::runtime_error::runtime_error(prVar2,(string *)&t_ref);
      __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    pVar3 = booster::ptime::nanoseconds(0x3b9aca64);
    local_2b8.sec = pVar3.sec;
    local_2b8.nsec = pVar3.nsec;
    if ((local_2b8.sec == 1) && (local_2b8.nsec == 100)) {
      pVar3 = booster::ptime::seconds(0xf);
      local_2b8.sec = pVar3.sec;
      local_2b8.nsec = pVar3.nsec;
      _oss = 0xf;
      booster::ptime::normalize((ptime *)&oss);
      if ((local_2b8.sec != _oss) || ((local_2b8.nsec != 0 || (local_2b8.sec != 0xf)))) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
        poVar1 = std::operator<<((ostream *)&oss,"Error ");
        poVar1 = std::operator<<(poVar1,
                                 "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/ptime/test/test_posix_time.cpp"
                                );
        poVar1 = std::operator<<(poVar1,":");
        poVar1 = (ostream *)std::ostream::operator<<(poVar1,0x36);
        std::operator<<(poVar1," p==ptime(15) && ptime::seconds(p)==15");
        prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::__cxx11::stringbuf::str();
        std::runtime_error::runtime_error(prVar2,(string *)&t_ref);
        __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      pVar3 = booster::ptime::minutes(0xf);
      local_2b8.sec = pVar3.sec;
      local_2b8.nsec = pVar3.nsec;
      _oss = 900;
      booster::ptime::normalize((ptime *)&oss);
      if (((local_2b8.sec != _oss) || (local_2b8.nsec != 0)) || (0x3b < local_2b8.sec - 900U)) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
        poVar1 = std::operator<<((ostream *)&oss,"Error ");
        poVar1 = std::operator<<(poVar1,
                                 "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/ptime/test/test_posix_time.cpp"
                                );
        poVar1 = std::operator<<(poVar1,":");
        poVar1 = (ostream *)std::ostream::operator<<(poVar1,0x38);
        std::operator<<(poVar1," p==ptime(15*60) && ptime::minutes(p)==15");
        prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::__cxx11::stringbuf::str();
        std::runtime_error::runtime_error(prVar2,(string *)&t_ref);
        __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      pVar3 = booster::ptime::hours(0xf);
      local_2b8.sec = pVar3.sec;
      local_2b8.nsec = pVar3.nsec;
      _oss = 54000;
      booster::ptime::normalize((ptime *)&oss);
      if (((local_2b8.sec == _oss) && (local_2b8.nsec == 0)) && (local_2b8.sec - 54000U < 0xe10)) {
        pVar3 = booster::ptime::days(0xf);
        local_2b8.sec = pVar3.sec;
        local_2b8.nsec = pVar3.nsec;
        _oss = 0x13c680;
        booster::ptime::normalize((ptime *)&oss);
        if (((local_2b8.sec == _oss) && (local_2b8.nsec == 0)) &&
           (local_2b8.sec - 0x13c680U < 0x15180)) {
          _oss = 100;
          booster::ptime::normalize((ptime *)&oss);
          local_2b8.nsec = 0x3b9aca01;
          local_2b8.sec = _oss;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
          poVar1 = std::operator<<((ostream *)&oss,"Error ");
          poVar1 = std::operator<<(poVar1,
                                   "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/ptime/test/test_posix_time.cpp"
                                  );
          poVar1 = std::operator<<(poVar1,":");
          poVar1 = (ostream *)std::ostream::operator<<(poVar1,0x3f);
          std::operator<<(poVar1," p.get_seconds()==101 && p.get_nanoseconds()==1");
          prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::__cxx11::stringbuf::str();
          std::runtime_error::runtime_error(prVar2,(string *)&t_ref);
          __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
        poVar1 = std::operator<<((ostream *)&oss,"Error ");
        poVar1 = std::operator<<(poVar1,
                                 "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/ptime/test/test_posix_time.cpp"
                                );
        poVar1 = std::operator<<(poVar1,":");
        poVar1 = (ostream *)std::ostream::operator<<(poVar1,0x3c);
        std::operator<<(poVar1," p==ptime(15*3600*24) && ptime::days(p)==15");
        prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::__cxx11::stringbuf::str();
        std::runtime_error::runtime_error(prVar2,(string *)&t_ref);
        __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
      poVar1 = std::operator<<((ostream *)&oss,"Error ");
      poVar1 = std::operator<<(poVar1,
                               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/ptime/test/test_posix_time.cpp"
                              );
      poVar1 = std::operator<<(poVar1,":");
      poVar1 = (ostream *)std::ostream::operator<<(poVar1,0x3a);
      std::operator<<(poVar1," p==ptime(15*3600) && ptime::hours(p)==15");
      prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::stringbuf::str();
      std::runtime_error::runtime_error(prVar2,(string *)&t_ref);
      __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
    poVar1 = std::operator<<((ostream *)&oss,"Error ");
    poVar1 = std::operator<<(poVar1,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/ptime/test/test_posix_time.cpp"
                            );
    poVar1 = std::operator<<(poVar1,":");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,0x34);
    std::operator<<(poVar1," p.get_seconds()==1 && p.get_nanoseconds() == 100");
    prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar2,(string *)&t_ref);
    __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
  poVar1 = std::operator<<((ostream *)&oss,"Error ");
  poVar1 = std::operator<<(poVar1,
                           "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/ptime/test/test_posix_time.cpp"
                          );
  poVar1 = std::operator<<(poVar1,":");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,0x27);
  std::operator<<(poVar1," p==ptime(15,0)");
  prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::stringbuf::str();
  std::runtime_error::runtime_error(prVar2,(string *)&t_ref);
  __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

int main()
{
	try {
		using booster::ptime;

		std::cout << "- Testing ptime" << std::endl;
		ptime p;
		TEST(p==ptime::zero);
		TEST(p.get_seconds()==0 && p.get_nanoseconds()==0);
		p=ptime(10,20);
		TEST(p==ptime(10,20));
		TEST(p.get_seconds()==10 && p.get_nanoseconds()==20);
		
		p=ptime(15);
		TEST(p==ptime(15,0));
		TEST(p.get_seconds()==15 && p.get_nanoseconds()==0);


		p=ptime::milliseconds(2100);
		TEST(p.get_seconds()==2 && p.get_nanoseconds() == 100000000);
		TEST(ptime::milliseconds(p)==2100);
		TEST(p.get_milliseconds()==100);
		p=ptime::microseconds(3230000);
		TEST(p.get_seconds() == 3 && p.get_nanoseconds() == 230000000);
		TEST(ptime::microseconds(p)==3230000);
		TEST(p.get_microseconds()==230000);
		p=ptime::nanoseconds(1000000100);
		TEST(p.get_seconds()==1 && p.get_nanoseconds() == 100);
		p=ptime::seconds(15);
		TEST(p==ptime(15) && ptime::seconds(p)==15);
		p=ptime::minutes(15);
		TEST(p==ptime(15*60) && ptime::minutes(p)==15);
		p=ptime::hours(15);
		TEST(p==ptime(15*3600) && ptime::hours(p)==15);
		p=ptime::days(15);
		TEST(p==ptime(15*3600*24) && ptime::days(p)==15);
		
		p=ptime(100,1000000001);
		TEST(p.get_seconds()==101 && p.get_nanoseconds()==1);
		
		p=ptime(100,2000000001);
		TEST(p.get_seconds()==102 && p.get_nanoseconds()==1);

		p=ptime(100,2000000000);
		TEST(p.get_seconds()==102 && p.get_nanoseconds()==0);
		
		p=ptime(100,-999999999);
		TEST(p.get_seconds()==99 && p.get_nanoseconds()==1);
		
		p=ptime(100,-1999999998);
		TEST(p.get_seconds()==98 && p.get_nanoseconds()==2);

		TEST(ptime(100,0)!=ptime(101,0));
		TEST(ptime(100,1)!=ptime(100,0));
		TEST(ptime(101,1)!=ptime(100,0));
		TEST(ptime(100,3)==ptime(100,3));
		TEST(ptime(100,3)<=ptime(100,3));
		TEST(ptime(100,3)>=ptime(100,3));

		TEST(ptime(100,2)+ptime(101,3)==ptime(201,5));
		TEST(ptime(100,2)+ptime(1,999999999)==ptime(102,1));
		TEST(ptime(100,0)-ptime(1,1)==ptime(98,999999999));
		TEST(ptime(100,0)-ptime(0,999999999)==ptime(99,1));
		TEST(ptime(100,10)-ptime(1,5)==ptime(99,5));

		test_lower(ptime(100,0),ptime(101,0));
		test_lower(ptime(100,0),ptime(100,1));
		p=ptime(10,100000000);
		TEST(10.099999 < ptime::to_number(p) && ptime::to_number(p) < 10.10001);
		TEST(ptime(10, 9999990) < ptime::from_number(10.1) && ptime::from_number(10.1) <ptime(10,100000010));

		ptime start=ptime::now();
		ptime::sleep(ptime::milliseconds(100));
		ptime end = ptime::now();
		int diff = ptime::milliseconds(end-start);
		TEST(100 <= diff && diff <=300);

		std::cout << "- Testing ctime" << std::endl;
		std::cout << "- Testing timegm normalization" << std::endl;	
	
		std::tm src = std::tm();
		src.tm_year = 2011 - 1900;
		src.tm_mday = 14;
		src.tm_mon = 1; // feb

		{
			std::tm mon=src;
			mon.tm_mon+=13;
			booster::normalize_universal_time(mon);
			TEST(mon.tm_mon == 2);
			TEST(mon.tm_year == 2012 - 1900);
			TEST(mon.tm_mday == 14);
		}
		{
			std::tm mon=src;
			mon.tm_mon-=24;
			booster::normalize_universal_time(mon);
			TEST(mon.tm_mon == 1);
			TEST(mon.tm_year == 2009 - 1900);
			TEST(mon.tm_mday == 14);
		}
		{
			std::tm mon=src;
			mon.tm_mday+=15;
			booster::normalize_universal_time(mon);
			TEST(mon.tm_mon == 2);
			TEST(mon.tm_year == 2011 - 1900);
			TEST(mon.tm_mday == 1);
		}
		{
			std::tm mon=src;
			mon.tm_year = 2000 - 1900;
			mon.tm_mday+=15;
			booster::normalize_universal_time(mon);
			TEST(mon.tm_mon == 1);
			TEST(mon.tm_year == 2000 - 1900);
			TEST(mon.tm_mday == 29);
		}
	
		std::cout << "- Testing timegm implementation" << std::endl;	
		long long range = 500LL * 3600 * 24 * 366;
		if(range > std::numeric_limits<time_t>::max()) {
			range = std::numeric_limits<time_t>::max() - 3600 * 24;
		}
#ifdef BOOSTER_WIN_NATIVE
		// Under Windows localtime and gmtime are valid for positive time_t values
		// only
		long long low_point = 0;
#else
		long long low_point = -range;
#endif
		long long top_point = +range;

		for(time_t pt = low_point;pt < top_point;pt+=3600 * 12) {
			// One is system other is mine
			std::tm t_ref = booster::universal_time(pt);
			TEST(booster::make_universal_time(booster::universal_time(pt)) == pt);
			std::tm t_cpy = std::tm();
			t_cpy.tm_year = t_ref.tm_year;
			t_cpy.tm_mon = t_ref.tm_mon;
			t_cpy.tm_mday = t_ref.tm_mday;
			t_cpy.tm_hour = t_ref.tm_hour;
			t_cpy.tm_min = t_ref.tm_min;
			t_cpy.tm_sec = t_ref.tm_sec;
			t_cpy.tm_isdst = -1;
			TEST(booster::normalize_universal_time(t_cpy) == pt);
			TEST(t_cpy.tm_wday == t_ref.tm_wday);
			TEST(t_cpy.tm_yday == t_ref.tm_yday);
		}



	}
	catch(std::exception const &e) {
		std::cerr << "Fail " << e.what() << std::endl;
		return 1;
	}
	std::cout << "Ok" << std::endl;
}